

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_version.cc
# Opt level: O2

void rbdl_check_api_version(int version)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  allocator<char> local_350 [32];
  allocator<char> local_330 [32];
  ostringstream link_version_string;
  ostringstream compile_version_string;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&link_version_string,"",local_350);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&compile_version_string,(string *)&link_version_string,_S_out);
  std::__cxx11::string::~string((string *)&link_version_string);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&compile_version_string,3);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,3);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<((ostream *)poVar1,1);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_350,"",local_330);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&link_version_string,(string *)local_350,_S_out);
  uVar2 = (uint)version >> 0x10 & 0xff;
  std::__cxx11::string::~string((string *)local_350);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&link_version_string,uVar2);
  poVar1 = std::operator<<(poVar1,".");
  uVar3 = (uint)version >> 8 & 0xff;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uVar3);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<((ostream *)poVar1,version & 0xff);
  if (uVar2 == 3) {
    if (uVar3 != 3) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Warning: RBDL library is of version ");
      std::__cxx11::stringbuf::str();
      poVar1 = std::operator<<(poVar1,(string *)local_350);
      poVar1 = std::operator<<(poVar1," but rbdl_config.h is from version ");
      std::__cxx11::stringbuf::str();
      poVar1 = std::operator<<(poVar1,(string *)local_330);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)local_330);
      std::__cxx11::string::~string((string *)local_350);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&link_version_string);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&compile_version_string);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "Error: trying to link against an incompatible RBDL library.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"The library version is: ");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)local_350);
  poVar1 = std::operator<<(poVar1," but rbdl_config.h is version ");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,(string *)local_330);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_330);
  std::__cxx11::string::~string((string *)local_350);
  abort();
}

Assistant:

RBDL_DLLAPI void rbdl_check_api_version(int version) {
  int compile_version = rbdl_get_api_version();

  int compile_major = (compile_version & 0xff0000) >> 16;
  int compile_minor = (compile_version & 0x00ff00) >> 8;
  int compile_patch = (compile_version & 0x0000ff);

  std::ostringstream compile_version_string("");
  compile_version_string << compile_major << "." << compile_minor << "."
    << compile_patch;

  int version_major = (version & 0xff0000) >> 16;
  int version_minor = (version & 0x00ff00) >> 8;
  int version_patch = (version & 0x0000ff);

  std::ostringstream link_version_string ("");
  link_version_string << version_major << "." << version_minor << "."
    << version_patch;

  if (version_major != compile_major) {
    std::cerr << "Error: trying to link against an incompatible RBDL library."
      << std::endl;
    std::cerr << "The library version is: " << compile_version_string.str()
      << " but rbdl_config.h is version " << link_version_string.str()
      << std::endl;
    abort();
  } else if (version_minor != compile_minor) {
    std::cout << "Warning: RBDL library is of version "
      << compile_version_string.str() << " but rbdl_config.h is from version "
      << link_version_string.str() << std::endl;
  }
}